

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O1

void __thiscall
irr::scene::CSkinnedMesh::getFrameData
          (CSkinnedMesh *this,f32 frame,SJoint *joint,vector3df *position,s32 *positionHint,
          vector3df *scale,s32 *scaleHint,quaternion *rotation,s32 *rotationHint)

{
  ulong uVar1;
  quaternion *pqVar2;
  f32 *pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  uint uVar18;
  SJoint *pSVar19;
  pointer pSVar20;
  pointer pSVar21;
  pointer pSVar22;
  double dVar23;
  undefined1 auVar24 [16];
  f32 fVar25;
  f32 fVar26;
  f32 fVar27;
  int iVar28;
  uint uVar29;
  pointer pSVar30;
  pointer pSVar31;
  ulong uVar32;
  pointer pSVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  
  pSVar19 = joint->UseAnimationFrom;
  if (pSVar19 == (SJoint *)0x0) {
    return;
  }
  pSVar20 = (pSVar19->PositionKeys).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar29 = (uint)((ulong)((long)(pSVar19->PositionKeys).m_data.
                                super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar20) >> 4);
  if (uVar29 != 0) {
    uVar18 = *positionHint;
    uVar32 = (ulong)uVar18;
    if (((int)uVar18 < 0) || (uVar29 <= uVar18)) {
LAB_001a24e7:
      uVar32 = 0xffffffff;
    }
    else if (((int)uVar18 < 1) ||
            (((float)pSVar20[uVar32].frame < (float)frame ||
             ((float)frame < (float)pSVar20[uVar18 - 1].frame ||
              (float)frame == (float)pSVar20[uVar18 - 1].frame)))) {
      uVar1 = uVar32 + 1;
      if (((int)uVar29 <= (int)uVar1) || ((float)pSVar20[uVar1].frame < (float)frame))
      goto LAB_001a24e7;
      pSVar30 = pSVar20 + uVar32;
      uVar32 = 0xffffffff;
      if ((float)pSVar30->frame <= (float)frame && (float)frame != (float)pSVar30->frame) {
        *positionHint = (int)uVar1;
        uVar32 = uVar1 & 0xffffffff;
      }
    }
    if ((int)uVar32 == -1) {
      uVar32 = 0;
      pSVar30 = pSVar20;
      do {
        if ((float)frame <= (float)pSVar30->frame) {
          *positionHint = (s32)uVar32;
          goto LAB_001a2521;
        }
        uVar32 = uVar32 + 1;
        pSVar30 = pSVar30 + 1;
      } while (uVar29 + (uVar29 == 0) != uVar32);
      uVar32 = 0xffffffff;
    }
LAB_001a2521:
    iVar28 = (int)uVar32;
    if (iVar28 != -1) {
      if (iVar28 == 0 || this->field_0xb5 == '\0') {
        position->Z = pSVar20[uVar32 & 0xffffffff].position.Z;
        fVar8 = pSVar20[uVar32 & 0xffffffff].position.Y;
        position->X = pSVar20[uVar32 & 0xffffffff].position.X;
        position->Y = fVar8;
      }
      else if (this->field_0xb5 == '\x01') {
        uVar32 = uVar32 & 0xffffffff;
        uVar29 = iVar28 - 1;
        fVar37 = (float)frame - (float)pSVar20[uVar32].frame;
        fVar8 = pSVar20[uVar29].position.Z;
        fVar15 = pSVar20[uVar32].position.Z;
        fVar41 = ((float)pSVar20[uVar29].frame - (float)frame) + fVar37;
        uVar4 = pSVar20[uVar29].position.X;
        uVar11 = pSVar20[uVar29].position.Y;
        uVar5 = pSVar20[uVar32].position.X;
        uVar12 = pSVar20[uVar32].position.Y;
        auVar38._0_4_ = (float)uVar4 - (float)uVar5;
        auVar38._4_4_ = (float)uVar11 - (float)uVar12;
        auVar38._8_8_ = 0;
        auVar40._4_4_ = fVar41;
        auVar40._0_4_ = fVar41;
        auVar40._8_8_ = 0;
        auVar40 = divps(auVar38,auVar40);
        position->X = fVar37 * auVar40._0_4_ + (float)uVar5;
        position->Y = fVar37 * auVar40._4_4_ + (float)uVar12;
        position->Z = ((fVar8 - fVar15) / fVar41) * fVar37 + fVar15;
      }
    }
  }
  pSVar21 = (pSVar19->ScaleKeys).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SScaleKey,_std::allocator<irr::scene::ISkinnedMesh::SScaleKey>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar29 = (uint)((ulong)((long)(pSVar19->ScaleKeys).m_data.
                                super__Vector_base<irr::scene::ISkinnedMesh::SScaleKey,_std::allocator<irr::scene::ISkinnedMesh::SScaleKey>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar21) >> 4);
  if (uVar29 != 0) {
    uVar18 = *scaleHint;
    uVar32 = (ulong)uVar18;
    if (((int)uVar18 < 0) || (uVar29 <= uVar18)) {
LAB_001a2635:
      uVar32 = 0xffffffff;
    }
    else if (((int)uVar18 < 1) ||
            (((float)pSVar21[uVar32].frame < (float)frame ||
             ((float)frame < (float)pSVar21[uVar18 - 1].frame ||
              (float)frame == (float)pSVar21[uVar18 - 1].frame)))) {
      uVar1 = uVar32 + 1;
      if (((int)uVar29 <= (int)uVar1) || ((float)pSVar21[uVar1].frame < (float)frame))
      goto LAB_001a2635;
      pSVar33 = pSVar21 + uVar32;
      uVar32 = 0xffffffff;
      if ((float)pSVar33->frame <= (float)frame && (float)frame != (float)pSVar33->frame) {
        *scaleHint = (int)uVar1;
        uVar32 = uVar1 & 0xffffffff;
      }
    }
    if ((int)uVar32 == -1) {
      uVar32 = 0;
      pSVar33 = pSVar21;
      do {
        if ((float)frame <= (float)pSVar33->frame) {
          *scaleHint = (s32)uVar32;
          goto LAB_001a266a;
        }
        uVar32 = uVar32 + 1;
        pSVar33 = pSVar33 + 1;
      } while (uVar29 + (uVar29 == 0) != uVar32);
      uVar32 = 0xffffffff;
    }
LAB_001a266a:
    iVar28 = (int)uVar32;
    if (iVar28 != -1) {
      if (iVar28 == 0 || this->field_0xb5 == '\0') {
        scale->Z = pSVar21[uVar32 & 0xffffffff].scale.Z;
        fVar8 = pSVar21[uVar32 & 0xffffffff].scale.Y;
        scale->X = pSVar21[uVar32 & 0xffffffff].scale.X;
        scale->Y = fVar8;
      }
      else if (this->field_0xb5 == '\x01') {
        uVar32 = uVar32 & 0xffffffff;
        uVar29 = iVar28 - 1;
        fVar37 = (float)frame - (float)pSVar21[uVar32].frame;
        fVar8 = pSVar21[uVar29].scale.Z;
        fVar15 = pSVar21[uVar32].scale.Z;
        fVar41 = ((float)pSVar21[uVar29].frame - (float)frame) + fVar37;
        uVar6 = pSVar21[uVar29].scale.X;
        uVar13 = pSVar21[uVar29].scale.Y;
        uVar7 = pSVar21[uVar32].scale.X;
        uVar14 = pSVar21[uVar32].scale.Y;
        auVar39._0_4_ = (float)uVar6 - (float)uVar7;
        auVar39._4_4_ = (float)uVar13 - (float)uVar14;
        auVar39._8_8_ = 0;
        auVar24._4_4_ = fVar41;
        auVar24._0_4_ = fVar41;
        auVar24._8_8_ = 0;
        auVar40 = divps(auVar39,auVar24);
        scale->X = fVar37 * auVar40._0_4_ + (float)uVar7;
        scale->Y = fVar37 * auVar40._4_4_ + (float)uVar14;
        scale->Z = ((fVar8 - fVar15) / fVar41) * fVar37 + fVar15;
      }
    }
  }
  pSVar22 = (pSVar19->RotationKeys).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SRotationKey,_std::allocator<irr::scene::ISkinnedMesh::SRotationKey>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar29 = (int)((ulong)((long)(pSVar19->RotationKeys).m_data.
                               super__Vector_base<irr::scene::ISkinnedMesh::SRotationKey,_std::allocator<irr::scene::ISkinnedMesh::SRotationKey>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar22) >> 2) *
           -0x33333333;
  if (uVar29 == 0) {
    return;
  }
  uVar18 = *rotationHint;
  uVar32 = (ulong)uVar18;
  if ((-1 < (int)uVar18) && (uVar18 < uVar29)) {
    if ((0 < (int)uVar18) &&
       (((float)frame <= (float)pSVar22[uVar32].frame &&
        ((float)pSVar22[uVar18 - 1].frame <= (float)frame &&
         (float)frame != (float)pSVar22[uVar18 - 1].frame)))) goto LAB_001a2787;
    uVar1 = uVar32 + 1;
    if (((int)uVar1 < (int)uVar29) && ((float)frame <= (float)pSVar22[uVar1].frame)) {
      pSVar31 = pSVar22 + uVar32;
      uVar32 = 0xffffffff;
      if ((float)pSVar31->frame <= (float)frame && (float)frame != (float)pSVar31->frame) {
        *rotationHint = (int)uVar1;
        uVar32 = uVar1 & 0xffffffff;
      }
      goto LAB_001a2787;
    }
  }
  uVar32 = 0xffffffff;
LAB_001a2787:
  if ((int)uVar32 == -1) {
    uVar32 = 0;
    pSVar31 = pSVar22;
    do {
      if ((float)frame <= (float)pSVar31->frame) {
        *rotationHint = (s32)uVar32;
        goto LAB_001a27b6;
      }
      uVar32 = uVar32 + 1;
      pSVar31 = pSVar31 + 1;
    } while (uVar29 + (uVar29 == 0) != uVar32);
    uVar32 = 0xffffffff;
  }
LAB_001a27b6:
  iVar28 = (int)uVar32;
  if (iVar28 != -1) {
    if (iVar28 == 0 || this->field_0xb5 == '\0') {
      pqVar2 = &pSVar22[uVar32 & 0xffffffff].rotation;
      fVar25 = pqVar2->Y;
      fVar26 = pqVar2->Z;
      fVar27 = pqVar2->W;
      rotation->X = pqVar2->X;
      rotation->Y = fVar25;
      rotation->Z = fVar26;
      rotation->W = fVar27;
    }
    else if (this->field_0xb5 == '\x01') {
      uVar32 = uVar32 & 0xffffffff;
      uVar29 = iVar28 - 1;
      fVar42 = (float)frame - (float)pSVar22[uVar32].frame;
      fVar8 = (float)pSVar22[uVar32].rotation.X;
      fVar15 = (float)pSVar22[uVar32].rotation.Y;
      pfVar3 = &pSVar22[uVar32].rotation.Z;
      fVar37 = (float)*pfVar3;
      fVar41 = (float)pfVar3[1];
      uVar9 = pSVar22[uVar29].rotation.X;
      uVar16 = pSVar22[uVar29].rotation.Y;
      uVar10 = pSVar22[uVar29].rotation.Z;
      uVar17 = pSVar22[uVar29].rotation.W;
      fVar36 = fVar41 * (float)uVar17 +
               fVar37 * (float)uVar10 + fVar8 * (float)uVar9 + fVar15 * (float)uVar16;
      fVar34 = -fVar36;
      if (fVar36 < fVar34) {
        fVar8 = -fVar8;
        fVar15 = -fVar15;
        fVar37 = -fVar37;
        fVar41 = -fVar41;
      }
      fVar42 = fVar42 / (((float)pSVar22[uVar29].frame - (float)frame) + fVar42);
      if (fVar34 <= fVar36) {
        fVar34 = fVar36;
      }
      if (fVar34 <= 0.95) {
        fVar34 = acosf(fVar34);
        fVar36 = sinf(fVar34);
        fVar35 = sinf((1.0 - fVar42) * fVar34);
        fVar35 = fVar35 * (1.0 / fVar36);
        fVar34 = sinf(fVar42 * fVar34);
        fVar34 = fVar34 * (1.0 / fVar36);
        rotation->X = (f32)((float)uVar9 * fVar34 + fVar8 * fVar35);
        rotation->Y = (f32)((float)uVar16 * fVar34 + fVar15 * fVar35);
        rotation->Z = (f32)((float)uVar10 * fVar34 + fVar37 * fVar35);
        rotation->W = (f32)((float)uVar17 * fVar34 + fVar41 * fVar35);
      }
      else {
        fVar34 = 1.0 - fVar42;
        fVar37 = fVar37 * fVar34 + fVar42 * (float)uVar10;
        fVar41 = fVar41 * fVar34 + fVar42 * (float)uVar17;
        fVar8 = fVar34 * fVar8 + (float)uVar9 * fVar42;
        fVar15 = fVar34 * fVar15 + (float)uVar16 * fVar42;
        dVar23 = (double)(fVar41 * fVar41 + fVar37 * fVar37 + fVar8 * fVar8 + fVar15 * fVar15);
        if (dVar23 < 0.0) {
          dVar23 = sqrt(dVar23);
        }
        else {
          dVar23 = SQRT(dVar23);
        }
        fVar34 = (float)(1.0 / dVar23);
        rotation->X = (f32)(fVar8 * fVar34);
        rotation->Y = (f32)(fVar15 * fVar34);
        rotation->Z = (f32)(fVar37 * fVar34);
        rotation->W = (f32)(fVar41 * fVar34);
      }
    }
  }
  return;
}

Assistant:

void CSkinnedMesh::getFrameData(f32 frame, SJoint *joint,
		core::vector3df &position, s32 &positionHint,
		core::vector3df &scale, s32 &scaleHint,
		core::quaternion &rotation, s32 &rotationHint)
{
	s32 foundPositionIndex = -1;
	s32 foundScaleIndex = -1;
	s32 foundRotationIndex = -1;

	if (joint->UseAnimationFrom) {
		const core::array<SPositionKey> &PositionKeys = joint->UseAnimationFrom->PositionKeys;
		const core::array<SScaleKey> &ScaleKeys = joint->UseAnimationFrom->ScaleKeys;
		const core::array<SRotationKey> &RotationKeys = joint->UseAnimationFrom->RotationKeys;

		if (PositionKeys.size()) {
			foundPositionIndex = -1;

			// Test the Hints...
			if (positionHint >= 0 && (u32)positionHint < PositionKeys.size()) {
				// check this hint
				if (positionHint > 0 && PositionKeys[positionHint].frame >= frame && PositionKeys[positionHint - 1].frame < frame)
					foundPositionIndex = positionHint;
				else if (positionHint + 1 < (s32)PositionKeys.size()) {
					// check the next index
					if (PositionKeys[positionHint + 1].frame >= frame &&
							PositionKeys[positionHint + 0].frame < frame) {
						positionHint++;
						foundPositionIndex = positionHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundPositionIndex == -1) {
				for (u32 i = 0; i < PositionKeys.size(); ++i) {
					if (PositionKeys[i].frame >= frame) { // Keys should to be sorted by frame
						foundPositionIndex = i;
						positionHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundPositionIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundPositionIndex == 0) {
					position = PositionKeys[foundPositionIndex].position;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SPositionKey &KeyA = PositionKeys[foundPositionIndex];
					const SPositionKey &KeyB = PositionKeys[foundPositionIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					position = ((KeyB.position - KeyA.position) / (fd1 + fd2)) * fd1 + KeyA.position;
				}
			}
		}

		//------------------------------------------------------------

		if (ScaleKeys.size()) {
			foundScaleIndex = -1;

			// Test the Hints...
			if (scaleHint >= 0 && (u32)scaleHint < ScaleKeys.size()) {
				// check this hint
				if (scaleHint > 0 && ScaleKeys[scaleHint].frame >= frame && ScaleKeys[scaleHint - 1].frame < frame)
					foundScaleIndex = scaleHint;
				else if (scaleHint + 1 < (s32)ScaleKeys.size()) {
					// check the next index
					if (ScaleKeys[scaleHint + 1].frame >= frame &&
							ScaleKeys[scaleHint + 0].frame < frame) {
						scaleHint++;
						foundScaleIndex = scaleHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundScaleIndex == -1) {
				for (u32 i = 0; i < ScaleKeys.size(); ++i) {
					if (ScaleKeys[i].frame >= frame) { // Keys should to be sorted by frame
						foundScaleIndex = i;
						scaleHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundScaleIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundScaleIndex == 0) {
					scale = ScaleKeys[foundScaleIndex].scale;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SScaleKey &KeyA = ScaleKeys[foundScaleIndex];
					const SScaleKey &KeyB = ScaleKeys[foundScaleIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					scale = ((KeyB.scale - KeyA.scale) / (fd1 + fd2)) * fd1 + KeyA.scale;
				}
			}
		}

		//-------------------------------------------------------------

		if (RotationKeys.size()) {
			foundRotationIndex = -1;

			// Test the Hints...
			if (rotationHint >= 0 && (u32)rotationHint < RotationKeys.size()) {
				// check this hint
				if (rotationHint > 0 && RotationKeys[rotationHint].frame >= frame && RotationKeys[rotationHint - 1].frame < frame)
					foundRotationIndex = rotationHint;
				else if (rotationHint + 1 < (s32)RotationKeys.size()) {
					// check the next index
					if (RotationKeys[rotationHint + 1].frame >= frame &&
							RotationKeys[rotationHint + 0].frame < frame) {
						rotationHint++;
						foundRotationIndex = rotationHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundRotationIndex == -1) {
				for (u32 i = 0; i < RotationKeys.size(); ++i) {
					if (RotationKeys[i].frame >= frame) { // Keys should be sorted by frame
						foundRotationIndex = i;
						rotationHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundRotationIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundRotationIndex == 0) {
					rotation = RotationKeys[foundRotationIndex].rotation;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SRotationKey &KeyA = RotationKeys[foundRotationIndex];
					const SRotationKey &KeyB = RotationKeys[foundRotationIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					const f32 t = fd1 / (fd1 + fd2);

					/*
					f32 t = 0;
					if (KeyA.frame!=KeyB.frame)
						t = (frame-KeyA.frame) / (KeyB.frame - KeyA.frame);
					*/

					rotation.slerp(KeyA.rotation, KeyB.rotation, t);
				}
			}
		}
	}
}